

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_unswitch_pass.cpp
# Opt level: O3

bool __thiscall
spvtools::opt::anon_unknown_0::LoopUnswitch::IsDynamicallyUniform
          (LoopUnswitch *this,Instruction *var,BasicBlock *entry,DominatorTree *post_dom_tree)

{
  IRContext *pIVar1;
  DefUseManager *pDVar2;
  DecorationManager *this_00;
  pointer pOVar3;
  uint **ppuVar4;
  bool bVar5;
  char cVar6;
  uint32_t uVar7;
  uint32_t uVar8;
  iterator iVar9;
  _func_void *p_Var10;
  BasicBlock *pBVar11;
  Instruction *pIVar12;
  uint **ppuVar13;
  pointer pOVar14;
  undefined8 *local_80;
  undefined8 local_78;
  code *local_70;
  code *local_68;
  DefUseManager *local_60;
  uint *local_58;
  _Any_data local_50;
  code *local_40;
  code *local_38;
  
  if (post_dom_tree->postdominator_ == false) {
    __assert_fail("post_dom_tree.IsPostDominator()",
                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/loop_unswitch_pass.cpp"
                  ,0x1ed,
                  "bool spvtools::opt::(anonymous namespace)::LoopUnswitch::IsDynamicallyUniform(Instruction *, const BasicBlock *, const DominatorTree &)"
                 );
  }
  pIVar1 = this->context_;
  if ((pIVar1->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
    IRContext::BuildDefUseManager(pIVar1);
  }
  pDVar2 = (pIVar1->def_use_mgr_)._M_t.
           super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
           ._M_t.
           super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
           .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>._M_head_impl;
  uVar7 = 0;
  if (var->has_result_id_ == true) {
    uVar7 = Instruction::GetSingleWordOperand(var,(uint)var->has_type_id_);
  }
  local_80 = (undefined8 *)CONCAT44(local_80._4_4_,uVar7);
  iVar9 = std::
          _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_bool>,_std::allocator<std::pair<const_unsigned_int,_bool>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&(this->dynamically_uniform_)._M_h,(key_type_conflict *)&local_80);
  if (iVar9.super__Node_iterator_base<std::pair<const_unsigned_int,_bool>,_false>._M_cur !=
      (__node_type *)0x0) {
    return (bool)*(undefined1 *)
                  ((long)iVar9.super__Node_iterator_base<std::pair<const_unsigned_int,_bool>,_false>
                         ._M_cur + 0xc);
  }
  pIVar1 = this->context_;
  local_60 = pDVar2;
  if ((pIVar1->valid_analyses_ & kAnalysisDecorations) == kAnalysisNone) {
    IRContext::BuildDecorationManager(pIVar1);
  }
  this_00 = (pIVar1->decoration_mgr_)._M_t.
            super___uniq_ptr_impl<spvtools::opt::analysis::DecorationManager,_std::default_delete<spvtools::opt::analysis::DecorationManager>_>
            ._M_t.
            super__Tuple_impl<0UL,_spvtools::opt::analysis::DecorationManager_*,_std::default_delete<spvtools::opt::analysis::DecorationManager>_>
            .super__Head_base<0UL,_spvtools::opt::analysis::DecorationManager_*,_false>._M_head_impl
  ;
  uVar8 = 0;
  uVar7 = 0;
  if (var->has_result_id_ == true) {
    uVar7 = Instruction::GetSingleWordOperand(var,(uint)var->has_type_id_);
  }
  local_80 = (undefined8 *)CONCAT44(local_80._4_4_,uVar7);
  p_Var10 = (_func_void *)
            std::__detail::
            _Map_base<unsigned_int,_std::pair<const_unsigned_int,_bool>,_std::allocator<std::pair<const_unsigned_int,_bool>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
            ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_bool>,_std::allocator<std::pair<const_unsigned_int,_bool>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          *)&this->dynamically_uniform_,(key_type *)&local_80);
  *p_Var10 = (_func_void)0x0;
  if (var->has_result_id_ == true) {
    uVar8 = Instruction::GetSingleWordOperand(var,(uint)var->has_type_id_);
  }
  local_50._8_8_ = 0;
  local_38 = std::
             _Function_handler<bool_(const_spvtools::opt::Instruction_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/loop_unswitch_pass.cpp:507:34)>
             ::_M_invoke;
  local_40 = std::
             _Function_handler<bool_(const_spvtools::opt::Instruction_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/loop_unswitch_pass.cpp:507:34)>
             ::_M_manager;
  local_50._M_unused._M_function_pointer = p_Var10;
  analysis::DecorationManager::WhileEachDecoration
            (this_00,uVar8,0x1a,(function<bool_(const_spvtools::opt::Instruction_&)> *)&local_50);
  if (local_40 != (code *)0x0) {
    (*local_40)(&local_50,&local_50,__destroy_functor);
  }
  if (*p_Var10 != (_func_void)0x0) {
    return true;
  }
  pBVar11 = IRContext::get_instr_block(this->context_,var);
  if (pBVar11 == (BasicBlock *)0x0) {
    *p_Var10 = (_func_void)0x1;
    return true;
  }
  pIVar12 = (pBVar11->label_)._M_t.
            super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
            ._M_t.
            super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
            .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
  uVar8 = 0;
  uVar7 = 0;
  if (pIVar12->has_result_id_ == true) {
    uVar7 = Instruction::GetSingleWordOperand(pIVar12,(uint)pIVar12->has_type_id_);
  }
  pIVar12 = (entry->label_)._M_t.
            super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
            ._M_t.
            super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
            .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
  if (pIVar12->has_result_id_ == true) {
    uVar8 = Instruction::GetSingleWordOperand(pIVar12,(uint)pIVar12->has_type_id_);
  }
  bVar5 = DominatorTree::Dominates(post_dom_tree,uVar7,uVar8);
  if (bVar5) {
    if (var->opcode_ == OpLoad) {
      uVar7 = (var->has_result_id_ & 1) + 1;
      if (var->has_type_id_ == false) {
        uVar7 = (uint)var->has_result_id_;
      }
      uVar7 = Instruction::GetSingleWordOperand(var,uVar7);
      pDVar2 = local_60;
      pIVar12 = analysis::DefUseManager::GetDef(local_60,uVar7);
      uVar7 = 0;
      if (pIVar12->has_type_id_ == true) {
        uVar7 = Instruction::GetSingleWordOperand(pIVar12,0);
      }
      pIVar12 = analysis::DefUseManager::GetDef(pDVar2,uVar7);
      uVar7 = (pIVar12->has_result_id_ & 1) + 1;
      if (pIVar12->has_type_id_ == false) {
        uVar7 = (uint)pIVar12->has_result_id_;
      }
      uVar7 = Instruction::GetSingleWordOperand(pIVar12,uVar7);
      if ((uVar7 & 0xfffffffd) == 0) {
LAB_00255b7c:
        local_78 = 0;
        local_80 = (undefined8 *)operator_new(0x18);
        *local_80 = entry;
        local_80[1] = post_dom_tree;
        local_80[2] = this;
        local_68 = std::
                   _Function_handler<bool_(unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/loop_unswitch_pass.cpp:539:44)>
                   ::_M_invoke;
        local_70 = std::
                   _Function_handler<bool_(unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/loop_unswitch_pass.cpp:539:44)>
                   ::_M_manager;
        pOVar14 = (var->operands_).
                  super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pOVar3 = (var->operands_).
                 super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        if (pOVar14 == pOVar3) {
          *p_Var10 = (_func_void)0x1;
          bVar5 = true;
        }
        else {
          do {
            bVar5 = spvIsInIdType(pOVar14->type);
            if (bVar5) {
              ppuVar4 = (uint **)(pOVar14->words).large_data_._M_t.
                                 super___uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                 .
                                 super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
                                 ._M_head_impl;
              ppuVar13 = &(pOVar14->words).small_data_;
              if (ppuVar4 != (uint **)0x0) {
                ppuVar13 = ppuVar4;
              }
              local_58 = *ppuVar13;
              if (local_70 == (code *)0x0) {
                std::__throw_bad_function_call();
              }
              cVar6 = (*local_68)(&local_80,&local_58);
              if (cVar6 == '\0') {
                bVar5 = false;
                goto LAB_00255c25;
              }
            }
            pOVar14 = pOVar14 + 1;
          } while (pOVar14 != pOVar3);
          bVar5 = true;
LAB_00255c25:
          *p_Var10 = (_func_void)bVar5;
          if (local_70 == (code *)0x0) {
            return bVar5;
          }
        }
        (*local_70)(&local_80,&local_80,3);
        return bVar5;
      }
    }
    else {
      bVar5 = IRContext::IsCombinatorInstruction(this->context_,var);
      if (bVar5) goto LAB_00255b7c;
    }
  }
  *p_Var10 = (_func_void)0x0;
  return false;
}

Assistant:

bool IsDynamicallyUniform(Instruction* var, const BasicBlock* entry,
                            const DominatorTree& post_dom_tree) {
    assert(post_dom_tree.IsPostDominator());
    analysis::DefUseManager* def_use_mgr = context_->get_def_use_mgr();

    auto it = dynamically_uniform_.find(var->result_id());

    if (it != dynamically_uniform_.end()) return it->second;

    analysis::DecorationManager* dec_mgr = context_->get_decoration_mgr();

    bool& is_uniform = dynamically_uniform_[var->result_id()];
    is_uniform = false;

    dec_mgr->WhileEachDecoration(var->result_id(),
                                 uint32_t(spv::Decoration::Uniform),
                                 [&is_uniform](const Instruction&) {
                                   is_uniform = true;
                                   return false;
                                 });
    if (is_uniform) {
      return is_uniform;
    }

    BasicBlock* parent = context_->get_instr_block(var);
    if (!parent) {
      return is_uniform = true;
    }

    if (!post_dom_tree.Dominates(parent->id(), entry->id())) {
      return is_uniform = false;
    }
    if (var->opcode() == spv::Op::OpLoad) {
      const uint32_t PtrTypeId =
          def_use_mgr->GetDef(var->GetSingleWordInOperand(0))->type_id();
      const Instruction* PtrTypeInst = def_use_mgr->GetDef(PtrTypeId);
      auto storage_class = spv::StorageClass(
          PtrTypeInst->GetSingleWordInOperand(kTypePointerStorageClassInIdx));
      if (storage_class != spv::StorageClass::Uniform &&
          storage_class != spv::StorageClass::UniformConstant) {
        return is_uniform = false;
      }
    } else {
      if (!context_->IsCombinatorInstruction(var)) {
        return is_uniform = false;
      }
    }

    return is_uniform = var->WhileEachInId([entry, &post_dom_tree,
                                            this](const uint32_t* id) {
      return IsDynamicallyUniform(context_->get_def_use_mgr()->GetDef(*id),
                                  entry, post_dom_tree);
    });
  }